

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O2

FTexture * DDSTexture_TryCreate(FileReader *data,int lumpnum)

{
  int iVar1;
  undefined4 extraout_var;
  FDDSTexture *this;
  anon_union_124_2_f77b7ddb *lump;
  anon_union_124_2_f77b7ddb anon_var_0;
  DDSFileHeader Header;
  
  (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])(data,0,0);
  iVar1 = (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,&Header,0x80);
  if (((((CONCAT44(extraout_var,iVar1) == 0x80) && (Header.Magic == 0x20534444)) &&
       (Header.Desc.Size == 0x7c || Header.Desc.Size == 0x20534444)) &&
      ((Header.Desc.PixelFormat.Size == 0x20 && ((~Header.Desc.Flags & 0x1007) == 0)))) &&
     ((Header.Desc.Width != 0 && (Header.Desc.Height != 0)))) {
    (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])(data,4,0);
    lump = &anon_var_0;
    (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,lump,0x7c);
    if ((anon_var_0.surfdesc.PixelFormat.Flags & 4) == 0) {
      if ((((anon_var_0.surfdesc.PixelFormat.Flags & 0x40) != 0) &&
          (0xffffffdf < anon_var_0.surfdesc.PixelFormat.RGBBitCount - 0x28)) &&
         (((anon_var_0.surfdesc.Flags._0_1_ & 8) == 0 || (0 < (int)anon_var_0.byteswapping[4])))) {
LAB_004e40ad:
        this = (FDDSTexture *)operator_new(0x90);
        FDDSTexture::FDDSTexture(this,(FileReader *)&lump->surfdesc,lumpnum,&anon_var_0);
        return &this->super_FTexture;
      }
    }
    else if ((((anon_var_0.surfdesc.PixelFormat.FourCC + 0xceaba7bc) * 0x100 |
              anon_var_0.surfdesc.PixelFormat.FourCC + 0xceaba7bc >> 0x18) < 5) &&
            ((anon_var_0.surfdesc.Flags._2_1_ & 8) != 0)) goto LAB_004e40ad;
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *DDSTexture_TryCreate (FileReader &data, int lumpnum)
{
	union
	{
		DDSURFACEDESC2	surfdesc;
		DWORD			byteswapping[sizeof(DDSURFACEDESC2) / 4];
	};

	if (!CheckDDS(data)) return NULL;

	data.Seek (4, SEEK_SET);
	data.Read (&surfdesc, sizeof(surfdesc));

#ifdef __BIG_ENDIAN__
	// Every single element of the header is a DWORD
	for (unsigned int i = 0; i < sizeof(DDSURFACEDESC2) / 4; ++i)
	{
		byteswapping[i] = LittleLong(byteswapping[i]);
	}
	// Undo the byte swap for the pixel format
	surfdesc.PixelFormat.FourCC = LittleLong(surfdesc.PixelFormat.FourCC);
#endif

	if (surfdesc.PixelFormat.Flags & DDPF_FOURCC)
	{
		// Check for supported FourCC
		if (surfdesc.PixelFormat.FourCC != ID_DXT1 &&
			surfdesc.PixelFormat.FourCC != ID_DXT2 &&
			surfdesc.PixelFormat.FourCC != ID_DXT3 &&
			surfdesc.PixelFormat.FourCC != ID_DXT4 &&
			surfdesc.PixelFormat.FourCC != ID_DXT5)
		{
			return NULL;
		}
		if (!(surfdesc.Flags & DDSD_LINEARSIZE))
		{
			return NULL;
		}
	}
	else if (surfdesc.PixelFormat.Flags & DDPF_RGB)
	{
		if ((surfdesc.PixelFormat.RGBBitCount >> 3) < 1 ||
			(surfdesc.PixelFormat.RGBBitCount >> 3) > 4)
		{
			return NULL;
		}
		if ((surfdesc.Flags & DDSD_PITCH) && (surfdesc.Pitch <= 0))
		{
			return NULL;
		}
	}
	else
	{
		return NULL;
	}
	return new FDDSTexture (data, lumpnum, &surfdesc);
}